

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermOrderingDiagram.cpp
# Opt level: O0

ostream * Kernel::operator<<(ostream *out,Node *node)

{
  ostream *poVar1;
  ostream *in_RSI;
  char *pcVar2;
  void *in_RDI;
  TermList *in_stack_00000030;
  Polynomial *in_stack_00000038;
  ostream *in_stack_00000040;
  undefined4 in_stack_ffffffffffffffe0;
  ostream *local_8;
  
  poVar1 = operator<<(in_RSI,(Tag *)CONCAT44(*(undefined4 *)in_RSI,in_stack_ffffffffffffffe0));
  pcVar2 = "? ";
  if (((byte)in_RSI[0x30] & 1) != 0) {
    pcVar2 = " ";
  }
  std::operator<<(poVar1,pcVar2);
  if (*(int *)in_RSI == 0) {
    local_8 = (ostream *)std::ostream::operator<<(in_RDI,*(void **)(in_RSI + 8));
  }
  else if (*(int *)in_RSI == 1) {
    poVar1 = operator<<((ostream *)in_stack_00000038,in_stack_00000030);
    std::operator<<(poVar1," ");
    local_8 = operator<<((ostream *)in_stack_00000038,in_stack_00000030);
  }
  else {
    local_8 = operator<<(in_stack_00000040,in_stack_00000038);
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const TermOrderingDiagram::Node& node)
{
  using Tag = TermOrderingDiagram::Node::Tag;
  out << (Tag)node.tag << (node.ready?" ":"? ");
  switch (node.tag) {
    case Tag::T_DATA: return out << node.data;
    case Tag::T_POLY: return out << *node.poly;
    case Tag::T_TERM: return out << node.lhs << " " << node.rhs;
  }
  ASSERTION_VIOLATION;
}